

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::SerializeWithCachedSizes
          (CodeGeneratorResponse *this,CodedOutputStream *output)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  long lVar2;
  
  if ((this->_has_bits_[0] & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->error_->_M_dataplus)._M_p,(int)this->error_->_M_string_length,SERIALIZE);
    internal::WireFormatLite::WriteString(1,this->error_,output);
  }
  if (0 < (this->file_).super_RepeatedPtrFieldBase.current_size_) {
    lVar2 = 0;
    do {
      internal::WireFormatLite::WriteMessageMaybeToArray
                (0xf,(MessageLite *)(this->file_).super_RepeatedPtrFieldBase.elements_[lVar2],output
                );
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->file_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    internal::WireFormat::SerializeUnknownFields(&this->_unknown_fields_,output);
    return;
  }
  return;
}

Assistant:

void CodeGeneratorResponse::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional string error = 1;
  if (has_error()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->error().data(), this->error().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->error(), output);
  }

  // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
  for (int i = 0; i < this->file_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      15, this->file(i), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}